

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O2

void __thiscall
Symbol::SetHasFuncAssignmentInternal(Symbol *this,ByteCodeGenerator *byteCodeGenerator)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar3;
  FuncInfo *pFVar4;
  char16_t *reason;
  
  if (this->hasFuncAssignment == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0x9b,"(!hasFuncAssignment)","!hasFuncAssignment");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->hasFuncAssignment = true;
  pFVar4 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  sourceContextId =
       Js::FunctionProxy::GetSourceContextId(&pFVar4->byteCodeFunction->super_FunctionProxy);
  functionId = Js::FunctionProxy::GetLocalFunctionId(&pFVar4->byteCodeFunction->super_FunctionProxy)
  ;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,StackFuncPhase,sourceContextId,functionId);
  if (bVar2) {
    Output::Print(L"HasFuncAssignment: %s\n",(this->name).string.ptr);
    Output::Flush();
  }
  if ((this->hasMaybeEscapedUse == false) && ((this->scope->field_0x44 & 2) == 0)) {
    return;
  }
  pFVar4 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  if (this->symbolType == STFormal) {
    reason = L"FormalAssignment";
  }
  else {
    reason = L"ObjectScopeAssignment";
    if ((this->scope->field_0x44 & 2) == 0) {
      reason = L"MaybeEscapedUse";
    }
  }
  FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar4,reason);
  return;
}

Assistant:

void Symbol::SetHasFuncAssignmentInternal(ByteCodeGenerator * byteCodeGenerator)
{
    Assert(!hasFuncAssignment);
    hasFuncAssignment = true;
    FuncInfo * top = byteCodeGenerator->TopFuncInfo();
    if (PHASE_TESTTRACE(Js::StackFuncPhase, top->byteCodeFunction))
    {
        Output::Print(_u("HasFuncAssignment: %s\n"), this->GetName().GetBuffer());
        Output::Flush();
    }

    if (this->GetHasMaybeEscapedUse() || this->GetScope()->GetIsObject())
    {
        byteCodeGenerator->TopFuncInfo()->SetHasMaybeEscapedNestedFunc(DebugOnly(
            this->GetIsFormal() ? _u("FormalAssignment") :
            this->GetScope()->GetIsObject() ? _u("ObjectScopeAssignment") :
            _u("MaybeEscapedUse")));
    }
}